

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  uint uVar1;
  Function FVar2;
  byte bVar3;
  bool *pbVar4;
  DataType dataType;
  char *pcVar5;
  char *pcVar6;
  TextureFormat format;
  size_t sVar7;
  char *texCoord;
  long lVar8;
  int iVar9;
  ostream *poVar10;
  char *lodBias;
  char *pcVar11;
  ostringstream *poVar12;
  byte bVar13;
  bool bVar14;
  ostringstream vert;
  ostringstream frag;
  undefined1 auStack_368 [2];
  byte local_366;
  char local_365;
  undefined4 local_364;
  bool *local_360;
  DataType local_354;
  uint local_350;
  TextureType local_34c;
  char *local_348;
  long *local_340 [2];
  long local_330 [2];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  FVar2 = (this->m_lookupSpec).function;
  local_365 = (this->super_ShaderRenderCase).m_isVertexCase;
  bVar14 = (this->m_textureSpec).type == TEXTURETYPE_2D;
  iVar9 = ((FVar2 == FUNCTION_TEXTUREPROJLOD || FVar2 == FUNCTION_TEXTUREPROJ) && bVar14) + 1;
  uVar1 = FVar2 - FUNCTION_TEXTURELOD;
  local_366 = (this->m_lookupSpec).useBias;
  if ((0x36U >> ((byte)FVar2 & 0x1f) & 1) == 0) {
    iVar9 = 0;
  }
  if (FUNCTION_TEXTUREPROJLOD3 < FVar2) {
    iVar9 = 0;
  }
  dataType = glu::getDataTypeFloatVec(iVar9 + (bVar14 ^ 3));
  pcVar5 = glu::getDataTypeName(dataType);
  pcVar6 = glu::getPrecisionName(PRECISION_MEDIUMP);
  format = glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  local_34c = (this->m_textureSpec).type;
  pcVar11 = "textureCube";
  if (local_34c == TEXTURETYPE_2D) {
    pcVar11 = "texture2D";
  }
  if (local_34c == TEXTURETYPE_CUBE_MAP) {
    local_354 = glu::getSamplerCubeType(format);
  }
  else {
    local_354 = TYPE_LAST;
    if (local_34c == TEXTURETYPE_2D) {
      local_354 = glu::getSampler2DType(format);
    }
  }
  FVar2 = (this->m_lookupSpec).function;
  switch(FVar2) {
  case FUNCTION_TEXTURE:
    local_360 = glcts::fixed_sample_locations_values + 1;
    break;
  case FUNCTION_TEXTUREPROJ:
  case FUNCTION_TEXTUREPROJ3:
    local_360 = (bool *)0x1cc5f62;
    break;
  case FUNCTION_TEXTURELOD:
    local_360 = (bool *)0x1cc5f55;
    break;
  case FUNCTION_TEXTUREPROJLOD:
  case FUNCTION_TEXTUREPROJLOD3:
    local_360 = (bool *)0x1cc5f70;
    break;
  default:
    local_364 = (undefined4)CONCAT71((uint7)(uint3)(FVar2 >> 8),1);
    local_360 = (bool *)0x0;
    goto LAB_00f2934e;
  }
  local_364 = 0;
LAB_00f2934e:
  local_350 = uVar1;
  local_348 = pcVar11;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar12 = (ostringstream *)local_1a8;
  if (local_365 != '\0') {
    poVar12 = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute highp vec4 a_position;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"attribute ",10);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_in0;\n",8);
  bVar13 = uVar1 < 3 | local_366;
  bVar3 = local_366 & 1;
  local_366 = bVar13;
  if (uVar1 < 3 || bVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"attribute ",10);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," float a_in1;\n",0xe);
  }
  if (local_365 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"varying ",8);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
    }
    else {
      sVar7 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_texCoord;\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying ",8);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x1c0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x1c0);
    }
    else {
      sVar7 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_texCoord;\n",0xd);
    if ((local_366 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"varying ",8);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x48);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar7);
      }
      pcVar5 = " float v_lodBias;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," float v_lodBias;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying ",8);
      if (pcVar6 == (char *)0x0) {
        lVar8 = 0x12;
        std::ios::clear((int)auStack_368 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x1c0);
      }
      else {
        sVar7 = strlen(pcVar6);
        lVar8 = 0x12;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
      }
      goto LAB_00f2975c;
    }
  }
  else {
    lVar8 = 0x1e;
    pcVar5 = "varying mediump vec4 v_color;\n";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_color;\n",0x1e);
LAB_00f2975c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"uniform lowp ",0xd);
  pcVar5 = glu::getDataTypeName(local_354);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," u_sampler;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  poVar10 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nvoid main()\n{\n",0xf);
  if (local_365 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_FragColor = ",0x10);
    pcVar5 = "v_texCoord";
    pcVar6 = "v_lodBias";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_color = ",0xb);
    pcVar5 = "a_in0";
    pcVar6 = "a_in1";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar12,local_348,(ulong)(local_34c != TEXTURETYPE_2D) * 2 + 9);
  pbVar4 = local_360;
  if ((char)local_364 == '\0') {
    sVar7 = strlen(local_360);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pbVar4,sVar7);
  }
  else {
    std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"(u_sampler, ",0xc);
  sVar7 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar5,sVar7);
  if ((local_350 < 3) || ((this->m_lookupSpec).useBias == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,", ",2);
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,");\n",3);
  if (local_365 == '\0') {
    poVar10 = (ostream *)local_320;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tv_texCoord = a_in0;\n",0x15);
    if ((local_366 & 1) == 0) goto LAB_00f29990;
    lVar8 = 0x14;
    pcVar5 = "\tv_lodBias = a_in1;\n";
  }
  else {
    lVar8 = 0x19;
    pcVar5 = "\tgl_FragColor = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar5,lVar8);
LAB_00f29990:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				is2DProj4			= m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD);
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= isProj ? (is2DProj4 ? 2 : 1) : 0;
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_MEDIUMP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	const char*			baseFuncName		= m_textureSpec.type == TEXTURETYPE_2D ? "texture2D" : "textureCube";
	const char*			funcExt				= DE_NULL;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = glu::getSamplerCubeType(texFmt);		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			funcExt = "";			break;
		case FUNCTION_TEXTUREPROJ:		funcExt = "Proj";		break;
		case FUNCTION_TEXTUREPROJ3:		funcExt = "Proj";		break;
		case FUNCTION_TEXTURELOD:		funcExt = "Lod";		break;
		case FUNCTION_TEXTUREPROJLOD:	funcExt = "ProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	funcExt = "ProjLod";	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "attribute highp vec4 a_position;\n"
		 << "attribute " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (hasLodBias)
		vert << "attribute " << coordPrecName << " float a_in1;\n";

	if (isVtxCase)
	{
		vert << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vert << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (hasLodBias)
		{
			vert << "varying " << coordPrecName << " float v_lodBias;\n";
			frag << "varying " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform lowp " << glu::getDataTypeName(samplerType) << " u_sampler;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\tgl_FragColor = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << baseFuncName << funcExt;
		op << "(u_sampler, " << texCoord;

		if (functionHasLod(function) || m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ");\n";
	}

	if (isVtxCase)
		frag << "\tgl_FragColor = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}